

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeBuffer.cpp
# Opt level: O2

void __thiscall cali::NodeBuffer::append(NodeBuffer *this,NodeInfo *info)

{
  Variant *v;
  cali_id_t cVar1;
  size_t sVar2;
  size_t sVar3;
  void *__src;
  long lVar4;
  uchar *buf;
  
  sVar3 = this->m_pos;
  v = &info->value;
  sVar2 = Variant::size(v);
  reserve(this,sVar3 + sVar2 + 0x32);
  buf = this->m_buffer + this->m_pos;
  cVar1 = info->parent_id;
  sVar3 = vlenc_u64((ulong)(cVar1 != 0xffffffffffffffff) + info->node_id * 2,buf);
  sVar2 = vlenc_u64(info->attr_id,buf + sVar3);
  lVar4 = sVar2 + sVar3;
  if (cVar1 != 0xffffffffffffffff) {
    sVar3 = vlenc_u64(info->parent_id,buf + lVar4);
    lVar4 = lVar4 + sVar3;
  }
  sVar3 = vlenc_u64((ulong)(byte)(v->m_v).type_and_size,buf + lVar4);
  sVar2 = Variant::size(v);
  sVar2 = vlenc_u64(sVar2,buf + sVar3 + lVar4);
  lVar4 = sVar2 + sVar3 + lVar4;
  __src = cali_variant_get_data(&v->m_v);
  sVar3 = Variant::size(v);
  memcpy(buf + lVar4,__src,sVar3);
  sVar3 = Variant::size(v);
  this->m_count = this->m_count + 1;
  this->m_pos = sVar3 + lVar4 + this->m_pos;
  return;
}

Assistant:

void NodeBuffer::append(const NodeInfo& info)
{
    reserve(m_pos + max_packed_size(info));

    m_pos += ::pack_node(m_buffer + m_pos, info);
    ++m_count;
}